

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopDescriptor::RemoveLoop(LoopDescriptor *this,Loop *loop)

{
  Loop **ppLVar1;
  pointer *pppLVar2;
  Loop **ppLVar3;
  pointer ppLVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  mapped_type pLVar7;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  _Var8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  Loop *pLVar11;
  mapped_type *ppLVar12;
  __hash_code __code;
  pointer ppLVar13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  _Hash_node_base *p_Var16;
  Loop *local_38;
  uint local_2c;
  
  pLVar11 = &this->placeholder_top_loop_;
  if (loop->parent_ != (Loop *)0x0) {
    pLVar11 = loop->parent_;
  }
  local_38 = loop;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((pLVar11->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pLVar11->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  ppLVar1 = _Var8._M_current + 1;
  ppLVar3 = (pLVar11->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 != ppLVar3) {
    memmove(_Var8._M_current,ppLVar1,(long)ppLVar3 - (long)ppLVar1);
  }
  pppLVar2 = &(pLVar11->nested_loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppLVar2 = *pppLVar2 + -1;
  ppLVar4 = (local_38->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar13 = (local_38->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppLVar13 != ppLVar4;
      ppLVar13 = ppLVar13 + 1) {
    (*ppLVar13)->parent_ = local_38->parent_;
  }
  std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>
            ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
             &pLVar11->nested_loops_,
             (pLVar11->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (local_38->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (local_38->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  p_Var16 = (local_38->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    do {
      local_2c = *(uint *)&p_Var16[1]._M_nxt;
      uVar5 = (this->basic_block_to_loop_)._M_h._M_bucket_count;
      uVar14 = (ulong)local_2c % uVar5;
      p_Var6 = (this->basic_block_to_loop_)._M_h._M_buckets[uVar14];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var6 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var6, p_Var15 = p_Var6->_M_nxt, *(uint *)&p_Var6->_M_nxt[1]._M_nxt != local_2c)
         ) {
        while (p_Var10 = p_Var15->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar5 != uVar14) ||
             (p_Var9 = p_Var15, p_Var15 = p_Var10, *(uint *)&p_Var10[1]._M_nxt == local_2c))
          goto LAB_002490c7;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_002490c7:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var9->_M_nxt;
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        pLVar11 = (Loop *)0x0;
      }
      else {
        pLVar11 = (Loop *)p_Var10[2]._M_nxt;
      }
      if (pLVar11 == local_38) {
        pLVar7 = pLVar11->parent_;
        ppLVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->basic_block_to_loop_,&local_2c);
        *ppLVar12 = pLVar7;
      }
      else {
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->basic_block_to_loop_)._M_h,&local_2c);
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  pLVar11 = local_38;
  if (_Var8._M_current ==
      (this->loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("it != loops_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x3fa,"void spvtools::opt::LoopDescriptor::RemoveLoop(Loop *)");
  }
  if (local_38 != (Loop *)0x0) {
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(local_38->loop_basic_blocks_)._M_h);
    ppLVar13 = (pLVar11->nested_loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppLVar13 != (pointer)0x0) {
      operator_delete(ppLVar13,(long)(pLVar11->nested_loops_).
                                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppLVar13);
    }
    operator_delete(pLVar11,0x90);
  }
  ppLVar1 = _Var8._M_current + 1;
  ppLVar3 = (this->loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 != ppLVar3) {
    memmove(_Var8._M_current,ppLVar1,(long)ppLVar3 - (long)ppLVar1);
  }
  pppLVar2 = &(this->loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppLVar2 = *pppLVar2 + -1;
  return;
}

Assistant:

void LoopDescriptor::RemoveLoop(Loop* loop) {
  Loop* parent = loop->GetParent() ? loop->GetParent() : &placeholder_top_loop_;
  parent->nested_loops_.erase(std::find(parent->nested_loops_.begin(),
                                        parent->nested_loops_.end(), loop));
  std::for_each(
      loop->nested_loops_.begin(), loop->nested_loops_.end(),
      [loop](Loop* sub_loop) { sub_loop->SetParent(loop->GetParent()); });
  parent->nested_loops_.insert(parent->nested_loops_.end(),
                               loop->nested_loops_.begin(),
                               loop->nested_loops_.end());
  for (uint32_t bb_id : loop->GetBlocks()) {
    Loop* l = FindLoopForBasicBlock(bb_id);
    if (l == loop) {
      SetBasicBlockToLoop(bb_id, l->GetParent());
    } else {
      ForgetBasicBlock(bb_id);
    }
  }

  LoopContainerType::iterator it =
      std::find(loops_.begin(), loops_.end(), loop);
  assert(it != loops_.end());
  delete loop;
  loops_.erase(it);
}